

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_create_art_index.cpp
# Opt level: O2

SinkResultType __thiscall
duckdb::PhysicalCreateARTIndex::SinkUnsorted(PhysicalCreateARTIndex *this,OperatorSinkInput *input)

{
  LocalSinkState *pLVar1;
  idx_t iVar2;
  ARTConflictType AVar3;
  ART *this_00;
  ConstraintException *this_01;
  long lVar4;
  long lVar5;
  allocator local_51;
  string local_50;
  
  pLVar1 = input->local_state;
  iVar2 = pLVar1[3].partition_info.batch_index.index;
  this_00 = (ART *)unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::
                   operator->((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                               *)(pLVar1 + 1));
  lVar5 = iVar2 + 1;
  lVar4 = 0;
  do {
    lVar5 = lVar5 + -1;
    if (lVar5 == 0) {
      return NEED_MORE_INPUT;
    }
    AVar3 = ART::Insert(this_00,&this_00->tree,
                        (ARTKey *)((long)pLVar1[4]._vptr_LocalSinkState + lVar4),0,
                        (ARTKey *)(lVar4 + pLVar1[6].partition_info.min_batch_index.index),
                        (GateStatus)((this_00->tree).super_IndexPointer.data >> 0x3f),
                        (optional_ptr<duckdb::ART,_true>)0x0,DEFAULT);
    lVar4 = lVar4 + 0x10;
  } while (AVar3 != CONSTRAINT);
  this_01 = (ConstraintException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Data contains duplicates on indexed column(s)",&local_51);
  ConstraintException::ConstraintException(this_01,&local_50);
  __cxa_throw(this_01,&ConstraintException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

SinkResultType PhysicalCreateARTIndex::SinkUnsorted(OperatorSinkInput &input) const {

	auto &l_state = input.local_state.Cast<CreateARTIndexLocalSinkState>();
	auto row_count = l_state.key_chunk.size();
	auto &art = l_state.local_index->Cast<ART>();

	// Insert each key and its corresponding row ID.
	for (idx_t i = 0; i < row_count; i++) {
		auto status = art.tree.GetGateStatus();
		auto conflict_type =
		    art.Insert(art.tree, l_state.keys[i], 0, l_state.row_ids[i], status, nullptr, IndexAppendMode::DEFAULT);
		D_ASSERT(conflict_type != ARTConflictType::TRANSACTION);
		if (conflict_type == ARTConflictType::CONSTRAINT) {
			throw ConstraintException("Data contains duplicates on indexed column(s)");
		}
	}

	return SinkResultType::NEED_MORE_INPUT;
}